

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

string * TellSeekRead(string *__return_storage_ptr__,string *FileName)

{
  _Ios_Openmode _Var1;
  ulong uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  allocator local_252;
  undefined1 local_251;
  fpos<__mbstate_t> local_250 [2];
  undefined8 local_230;
  pos_type FileSize;
  ifstream ResultReader;
  string *FileName_local;
  string *Results;
  
  _Var1 = std::operator|(_S_bin,_S_ate);
  std::ifstream::ifstream(&FileSize._M_state,(string *)FileName,_Var1);
  auVar4 = std::istream::tellg();
  FileSize._M_off = auVar4._8_8_;
  local_230 = auVar4._0_8_;
  std::fpos<__mbstate_t>::fpos(local_250,0);
  std::istream::seekg(&FileSize._M_state,local_250[0]._M_off,local_250[0]._M_state);
  local_251 = 0;
  uVar2 = std::fpos::operator_cast_to_long((fpos *)&local_230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,uVar2,'\0',&local_252);
  std::allocator<char>::~allocator((allocator<char> *)&local_252);
  lVar3 = std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  std::fpos::operator_cast_to_long((fpos *)&local_230);
  std::istream::read((char *)&FileSize._M_state,lVar3);
  local_251 = 1;
  std::ifstream::~ifstream(&FileSize._M_state);
  return __return_storage_ptr__;
}

Assistant:

std::string TellSeekRead(std::string FileName)
{
    std::ifstream ResultReader(FileName, std::ios::binary|std::ios::ate);
    auto FileSize = ResultReader.tellg();
    ResultReader.seekg(std::ios::beg);
    std::string Results(FileSize,0);
    ResultReader.read(&Results[0],FileSize);
    return Results;
}